

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O3

void __thiscall MainWindow::onFileOpen(MainWindow *this)

{
  bool bVar1;
  QByteArrayView QVar2;
  QString path;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QString local_38;
  QArrayData *local_20 [3];
  
  bVar1 = maybeSave(this);
  if (bVar1) {
    QMetaObject::tr((char *)local_20,(char *)&staticMetaObject,0x1b4e10);
    QVar2.m_data = (storage_type *)0x0;
    QVar2.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar2);
    local_78 = local_58;
    uStack_70 = uStack_50;
    local_68 = local_48;
    QMetaObject::tr((char *)&local_58,(char *)&staticMetaObject,0x1b5072);
    QFileDialog::getOpenFileName(&local_38,this,local_20,&local_78,&local_58,0,0);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,8);
      }
    }
    if (local_20[0] != (QArrayData *)0x0) {
      LOCK();
      (local_20[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_20[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_20[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_20[0],2,8);
      }
    }
    if (local_38.d.size != 0) {
      openFile(this,&local_38);
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
      }
    }
  }
  return;
}

Assistant:

void MainWindow::onFileOpen() {
    if (!maybeSave()) {
        return;
    }
    
    auto path = QFileDialog::getOpenFileName(
        this,
        tr("Open module"),
        "",
        tr(TU::MODULE_FILE_FILTER)
    );

    if (path.isEmpty()) {
        return;
    }

    openFile(path);

}